

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCommentImpl.cpp
# Opt level: O0

DOMNode * __thiscall xercesc_4_0::DOMCommentImpl::cloneNode(DOMCommentImpl *this,bool deep)

{
  int iVar1;
  undefined4 extraout_var;
  DOMCommentImpl *this_00;
  DOMNode *newNode;
  bool deep_local;
  DOMCommentImpl *this_local;
  
  iVar1 = (*(this->super_DOMComment).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])();
  this_00 = (DOMCommentImpl *)
            operator_new(0x50,(DOMDocument *)CONCAT44(extraout_var,iVar1),COMMENT_OBJECT);
  DOMCommentImpl(this_00,this,deep);
  DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_CLONED,(DOMNode *)this,(DOMNode *)this_00);
  return (DOMNode *)this_00;
}

Assistant:

DOMNode * DOMCommentImpl::cloneNode(bool deep) const
{
    DOMNode* newNode = new (getOwnerDocument(), DOMMemoryManager::COMMENT_OBJECT) DOMCommentImpl(*this, deep);
    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newNode);
    return newNode;
}